

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

void http1_websocket_client_on_hangup(http_settings_s *settings)

{
  void *pvVar1;
  websocket_settings_s *s;
  http_settings_s *settings_local;
  
  pvVar1 = settings->udata;
  if (pvVar1 != (void *)0x0) {
    if (*(long *)((long)pvVar1 + 0x20) != 0) {
      (**(code **)((long)pvVar1 + 0x20))(0,*(undefined8 *)((long)pvVar1 + 0x28));
    }
    fio_free(settings->udata);
    settings->udata = (void *)0x0;
  }
  return;
}

Assistant:

static void http1_websocket_client_on_hangup(http_settings_s *settings) {
  websocket_settings_s *s = settings->udata;
  if (s) {
    if (s->on_close)
      s->on_close(0, s->udata);
    fio_free(settings->udata);
    settings->udata = NULL;
  }
}